

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Basic.cpp
# Opt level: O2

int main(void)

{
  EvalState state;
  Program program;
  EvalState local_f0;
  allocator local_c8 [32];
  Program local_a8;
  string local_70;
  string local_50;
  
  EvalState::EvalState(&local_f0);
  Program::Program(&local_a8);
  do {
    std::__cxx11::string::string((string *)&local_70,"",local_c8);
    getLine(&local_50,&local_70);
    processLine(&local_50,&local_a8,&local_f0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  } while( true );
}

Assistant:

int main() {
   EvalState state;
   Program program;
   //cout << "Stub implementation of BASIC" << endl;
   while (true) {
      try {
         processLine(getLine(), program, state);
      } catch (ErrorException & ex) {
         cerr << "Error: " << ex.getMessage() << endl;
      }
   }
   return 0;
}